

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.cpp
# Opt level: O2

void __thiscall
glslang::HlslTokenStream::pushTokenStream(HlslTokenStream *this,TVector<glslang::HlslToken> *tokens)

{
  pointer pHVar1;
  TString *pTVar2;
  undefined4 uVar3;
  EHlslTokenClass EVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  TVector<glslang::HlslToken> *tokens_local;
  int local_14;
  
  tokens_local = tokens;
  if (this->preTokenStackSize == 0) {
    std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::push_back
              (&(this->currentTokenStack).
                super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>,
               &this->token);
    std::
    vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
    ::push_back(&(this->tokenStreamStack).
                 super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                ,&tokens_local);
    pHVar1 = (tokens_local->
             super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
             super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->token).field_2 = pHVar1->field_2;
    pTVar2 = (pHVar1->loc).name;
    iVar6 = (pHVar1->loc).string;
    iVar7 = (pHVar1->loc).line;
    uVar3 = *(undefined4 *)&(pHVar1->loc).field_0x14;
    EVar4 = pHVar1->tokenClass;
    uVar5 = *(undefined4 *)&pHVar1->field_0x1c;
    (this->token).loc.column = (pHVar1->loc).column;
    *(undefined4 *)&(this->token).loc.field_0x14 = uVar3;
    (this->token).tokenClass = EVar4;
    *(undefined4 *)&(this->token).field_0x1c = uVar5;
    (this->token).loc.name = pTVar2;
    (this->token).loc.string = iVar6;
    (this->token).loc.line = iVar7;
    local_14 = 0;
    std::vector<int,_glslang::pool_allocator<int>_>::emplace_back<int>
              (&(this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>,&local_14);
    return;
  }
  __assert_fail("preTokenStackSize == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslTokenStream.cpp"
                ,0x4e,"void glslang::HlslTokenStream::pushTokenStream(const TVector<HlslToken> *)");
}

Assistant:

void HlslTokenStream::pushTokenStream(const TVector<HlslToken>* tokens)
{
    // not yet setup to interrupt a stream that has been receded
    // and not yet reconsumed
    assert(preTokenStackSize == 0);

    // save current state
    currentTokenStack.push_back(token);

    // set up new token stream
    tokenStreamStack.push_back(tokens);

    // start position at first token:
    token = (*tokens)[0];
    tokenPosition.push_back(0);
}